

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall RandStrParser::exec(RandStrParser *this,vm_val_t *result)

{
  undefined1 auVar1 [16];
  int iVar2;
  vm_obj_id_t vVar3;
  wchar_t *str;
  ulong uVar4;
  vm_val_t *in_RSI;
  long in_RDI;
  wchar_t *dst;
  wchar_t *buf;
  size_t len;
  size_t in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  int in_root_set;
  void *local_28;
  void *charlen;
  
  in_root_set = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  iVar2 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))();
  str = (wchar_t *)(long)iVar2;
  if (str == (wchar_t *)0x0) {
    vVar3 = CVmObjString::create(in_root_set,in_stack_ffffffffffffffb8);
    vm_val_t::set_obj(in_RSI,vVar3);
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = str;
    uVar4 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    local_28 = operator_new__(uVar4);
    charlen = local_28;
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))(*(long **)(in_RDI + 0x10),&local_28);
    vVar3 = CVmObjString::create((int)((ulong)in_RSI >> 0x20),str,(size_t)charlen);
    vm_val_t::set_obj(in_RSI,vVar3);
    if (charlen != (void *)0x0) {
      operator_delete__(charlen);
    }
  }
  return;
}

Assistant:

void RandStrParser::exec(VMG_ vm_val_t *result)
{
    /* calculate the maximum length of the result */
    size_t len = tree->maxlen();

    /* if the maximum length is zero, just return an empty string */
    if (len == 0)
    {
        result->set_obj(CVmObjString::create(vmg_ FALSE, 0));
        return;
    }

    /* allocate a wchar_t buffer of the maximum length */
    wchar_t *buf = new wchar_t[len];

    /* generate the string */
    wchar_t *dst = buf;
    tree->generate(vmg_ dst);

    /* build the return string */
    result->set_obj(CVmObjString::create(vmg_ FALSE, buf, dst - buf));

    /* done with the temporary buffer */
    delete [] buf;
}